

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_test.cpp
# Opt level: O0

void __thiscall raw_test::on_end_of_content(raw_test *this)

{
  bool bVar1;
  byte bVar2;
  test_data *ptVar3;
  ostream *this_00;
  void *this_01;
  int in_stack_0000000c;
  basic_test *in_stack_00000010;
  char *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  allocator local_a1;
  string local_a0 [32];
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  string local_28 [40];
  
  ptVar3 = data((raw_test *)0x112e31);
  ptVar3->on_end_of_content = ptVar3->on_end_of_content + 1;
  cppcms::application::request();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"fail",&local_49);
  cppcms::http::request::get(local_28);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                          in_stack_ffffffffffffff18);
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (bVar1) {
    cppcms::application::request();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"abort",&local_a1);
    cppcms::http::request::get(local_80);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                            in_stack_ffffffffffffff18);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    if ((bVar2 & 1) != 0) {
      basic_test::do_abort(in_stack_00000010,in_stack_0000000c);
    }
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cerr,"FAIL: request().get(\"fail\")==\"\" in line: ")
    ;
    this_01 = (void *)std::ostream::operator<<(this_00,0xf4);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    g_fail = 1;
  }
  return;
}

Assistant:

void on_end_of_content(){
		data()->on_end_of_content++;
		TESTNT(request().get("fail")=="");
		if(request().get("abort")=="on_end_of_content")
			do_abort(503);

	}